

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O0

aphy_matrix3x3 * __thiscall
APhyBullet::BulletCollisionObject::getMatrix(BulletCollisionObject *this)

{
  btTransform *this_00;
  long in_RSI;
  aphy_matrix3x3 *in_RDI;
  
  this_00 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RSI + 0x10));
  btTransform::getBasis(this_00);
  convertMatrix((btMatrix3x3 *)in_RDI);
  return in_RDI;
}

Assistant:

aphy_matrix3x3 BulletCollisionObject::getMatrix()
{
    return convertMatrix(handle->getWorldTransform().getBasis());
}